

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O2

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::Camera>
          (Structure *this,Camera *dest,FileDatabase *db)

{
  uint in_EAX;
  int temp;
  undefined8 uStack_28;
  
  uStack_28._0_4_ = in_EAX;
  ReadField<2,Assimp::Blender::ID>(this,&dest->id,"id",db);
  uStack_28 = (ulong)(uint)uStack_28;
  ReadField<1,int>(this,(int *)((long)&uStack_28 + 4),"type",db);
  dest->type = uStack_28._4_4_;
  ReadField<1,int>(this,(int *)((long)&uStack_28 + 4),"flag",db);
  dest->flag = uStack_28._4_4_;
  ReadField<1,float>(this,&dest->lens,"lens",db);
  ReadField<1,float>(this,&dest->sensor_x,"sensor_x",db);
  ReadField<1,float>(this,&dest->clipsta,"clipsta",db);
  ReadField<1,float>(this,&dest->clipend,"clipend",db);
  StreamReader<true,_true>::IncPtr
            ((db->reader).
             super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,this->size);
  return;
}

Assistant:

void Structure :: Convert<Camera> (
    Camera& dest,
    const FileDatabase& db
    ) const
{

    ReadField<ErrorPolicy_Fail>(dest.id,"id",db);
    int temp = 0;
    ReadField<ErrorPolicy_Warn>(temp,"type",db);
    dest.type = static_cast<Assimp::Blender::Camera::Type>(temp);
    ReadField<ErrorPolicy_Warn>(temp,"flag",db);
    dest.flag = static_cast<Assimp::Blender::Camera::Type>(temp);
    ReadField<ErrorPolicy_Warn>(dest.lens,"lens",db);
    ReadField<ErrorPolicy_Warn>(dest.sensor_x,"sensor_x",db);
    ReadField<ErrorPolicy_Igno>(dest.clipsta,"clipsta",db);
    ReadField<ErrorPolicy_Igno>(dest.clipend,"clipend",db);

    db.reader->IncPtr(size);
}